

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::OptionalSemicolon(SQCompiler *this)

{
  long lVar1;
  SQInteger SVar2;
  
  lVar1 = this->_token;
  if (lVar1 == 0x3b) {
    SVar2 = SQLexer::Lex(&this->_lex);
    this->_token = SVar2;
  }
  else if (((((this->_lex)._prevtoken != 10) && (lVar1 != 0)) && (lVar1 != 0x3b)) && (lVar1 != 0x7d)
          ) {
    Error(this,"end of statement expected (; or lf)");
    return;
  }
  return;
}

Assistant:

void OptionalSemicolon()
    {
        if(_token == _SC(';')) { Lex(); return; }
        if(!IsEndOfStatement()) {
            Error(_SC("end of statement expected (; or lf)"));
        }
    }